

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDerivativesPreproc.cc
# Opt level: O0

int main(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  __type _Var4;
  initializer_list<int> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  bool bVar5;
  ostream *poVar6;
  size_type sVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  reference pvVar10;
  ulong uVar11;
  int id;
  int nd;
  vector<double,_std::allocator<double>_> anders;
  int io_2;
  vector<double,_std::allocator<double>_> vm_1;
  vector<double,_std::allocator<double>_> vp_1;
  int jp_1;
  vector<double,_std::allocator<double>_> parsm_1;
  vector<double,_std::allocator<double>_> parsp_1;
  int ip_1;
  int io_1;
  vector<double,_std::allocator<double>_> vm;
  vector<double,_std::allocator<double>_> vp;
  FeedForwardNN<double> nnm;
  FeedForwardNN<double> nnp_1;
  int jp;
  vector<double,_std::allocator<double>_> parsm;
  vector<double,_std::allocator<double>_> parsp;
  int ip;
  int io;
  vector<double,_std::allocator<double>_> ders;
  int np;
  vector<double,_std::allocator<double>_> pars;
  double eps;
  vector<double,_std::allocator<double>_> prepf;
  vector<double,_std::allocator<double>_> nnl;
  double *e;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  vector<double,_std::allocator<double>_> x;
  FeedForwardNN<double> nnp;
  FeedForwardNN<double> nn;
  vector<double,_std::allocator<double>_> parsprep;
  Preprocessing Preproc;
  vector<int,_std::allocator<int>_> arch;
  nullptr_t in_stack_fffffffffffff138;
  vector<double,_std::allocator<double>_> *this;
  undefined1 *puVar12;
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  *in_stack_fffffffffffff140;
  FeedForwardNN<double> *this_00;
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  *this_01;
  anon_class_1_0_00000001 *in_stack_fffffffffffff148;
  Preprocessing *Preproc_00;
  _Any_data *Preproc_01;
  _func_double_double_ptr *__f;
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  *in_stack_fffffffffffff150;
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  *in_stack_fffffffffffff158;
  value_type vVar13;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff160;
  double dVar14;
  allocator_type *in_stack_fffffffffffff168;
  FeedForwardNN<double> *in_stack_fffffffffffff170;
  function<double_(const_double_&)> *in_stack_fffffffffffff178;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff180;
  function<double_(const_double_&)> *in_stack_fffffffffffff188;
  FeedForwardNN<double> *in_stack_fffffffffffff190;
  bool *in_stack_fffffffffffff1a0;
  Preprocessing *in_stack_fffffffffffff1a8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff1b0;
  FeedForwardNN<double> *in_stack_fffffffffffff1c8;
  double local_e28;
  double local_d80;
  double local_d70;
  int local_ce0;
  vector<double,_std::allocator<double>_> local_cd8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff340;
  undefined4 in_stack_fffffffffffff348;
  undefined4 in_stack_fffffffffffff34c;
  int iVar15;
  int iVar16;
  vector<double,_std::allocator<double>_> local_cb0;
  vector<double,_std::allocator<double>_> local_c98;
  int local_c80;
  vector<double,_std::allocator<double>_> local_c78;
  vector<double,_std::allocator<double>_> local_c58;
  int local_c3c;
  double local_c38;
  int local_c2c;
  vector<double,_std::allocator<double>_> local_c28;
  vector<double,_std::allocator<double>_> local_c10;
  _Any_data local_bf8;
  undefined8 local_be8;
  FeedForwardNN<double> local_bd8;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  local_950;
  undefined1 local_92d;
  undefined4 local_92c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff890;
  FeedForwardNN<double> *in_stack_fffffffffffff898;
  int local_6e0;
  vector<double,_std::allocator<double>_> local_6d8;
  vector<double,_std::allocator<double>_> local_6b8;
  int local_69c;
  double local_698;
  int local_68c;
  vector<double,_std::allocator<double>_> local_688;
  int local_66c;
  vector<double,_std::allocator<double>_> local_668;
  undefined8 local_650;
  vector<double,_std::allocator<double>_> local_648;
  vector<double,_std::allocator<double>_> local_630;
  reference local_618;
  double *local_610;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_608;
  undefined1 *local_600;
  undefined8 local_5f0;
  undefined8 *local_5e8;
  undefined8 local_5e0;
  undefined1 local_5d8 [24];
  _Any_data local_5c0 [2];
  FeedForwardNN<double> local_5a0;
  Preprocessing local_368 [2];
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined1 local_2e1;
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 *local_a8;
  undefined8 local_a0;
  vector<double,_std::allocator<double>_> local_98 [3];
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 *local_30;
  undefined8 local_28;
  int local_4;
  
  local_4 = 0;
  local_40 = 1;
  local_3c = 5;
  local_38 = 5;
  local_34 = 2;
  local_30 = &local_40;
  local_28 = 4;
  std::allocator<int>::allocator((allocator<int> *)0x10256f);
  __l._M_len = (size_type)in_stack_fffffffffffff180;
  __l._M_array = (iterator)in_stack_fffffffffffff178;
  std::vector<int,_std::allocator<int>_>::vector
            (&in_stack_fffffffffffff170->_Arch,__l,(allocator_type *)in_stack_fffffffffffff168);
  std::allocator<int>::~allocator((allocator<int> *)0x1025a3);
  std::
  function<std::vector<double,std::allocator<double>>(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>const&)>
  ::function<main::__0,void>(in_stack_fffffffffffff150,in_stack_fffffffffffff148);
  local_b8 = 0x4000000000000000;
  uStack_b0 = 0x4008000000000000;
  local_c8 = 0xbff0000000000000;
  uStack_c0 = 0x3ff0000000000000;
  local_a8 = &local_c8;
  local_a0 = 4;
  std::allocator<double>::allocator((allocator<double> *)0x102607);
  __l_00._M_len = (size_type)in_stack_fffffffffffff180;
  __l_00._M_array = (iterator)in_stack_fffffffffffff178;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff170,__l_00,
             in_stack_fffffffffffff168);
  std::allocator<double>::~allocator((allocator<double> *)0x10263b);
  local_2dc = 0;
  local_2e0 = 1;
  local_2e1 = 1;
  std::
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  ::function(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
  local_328 = 0;
  uStack_320 = 0;
  local_318 = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10269e);
  std::function<double(double_const&)>::function<double(&)(double_const&),void>
            ((function<double_(const_double_&)> *)in_stack_fffffffffffff150,
             (_func_double_double_ptr *)in_stack_fffffffffffff148);
  Preproc_00 = local_368;
  std::function<double(double_const&)>::function<double(&)(double_const&),void>
            ((function<double_(const_double_&)> *)in_stack_fffffffffffff150,
             (_func_double_double_ptr *)in_stack_fffffffffffff148);
  nnad::FeedForwardNN<double>::FeedForwardNN
            (in_stack_fffffffffffff170,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff168,
             (int *)in_stack_fffffffffffff160,(OutputFunction *)in_stack_fffffffffffff158,
             (bool *)in_stack_fffffffffffff150,Preproc_00,in_stack_fffffffffffff180,
             in_stack_fffffffffffff188,
             (function<double_(const_double_&)> *)in_stack_fffffffffffff190);
  std::function<double_(const_double_&)>::~function((function<double_(const_double_&)> *)0x102740);
  std::function<double_(const_double_&)>::~function((function<double_(const_double_&)> *)0x10274d);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
  std::
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  ::~function((function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
               *)0x102767);
  local_5a0._ActFun.super__Function_base._M_manager._4_4_ = 0;
  local_5a0._ActFun.super__Function_base._M_manager._0_4_ = 2;
  local_5a0._ActFun.super__Function_base._M_functor._M_pod_data[0xf] = '\x01';
  this_00 = &local_5a0;
  std::function<double(double_const&)>::function<double(&)(double_const&),void>
            ((function<double_(const_double_&)> *)in_stack_fffffffffffff150,
             (_func_double_double_ptr *)Preproc_00);
  Preproc_01 = local_5c0;
  std::function<double(double_const&)>::function<double(&)(double_const&),void>
            ((function<double_(const_double_&)> *)in_stack_fffffffffffff150,
             (_func_double_double_ptr *)Preproc_00);
  this = local_98;
  nnad::FeedForwardNN<double>::FeedForwardNN
            (in_stack_fffffffffffff170,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff168,
             (int *)in_stack_fffffffffffff160,(OutputFunction *)in_stack_fffffffffffff158,
             (bool *)in_stack_fffffffffffff150,(Preprocessing *)Preproc_01,in_stack_fffffffffffff180
             ,in_stack_fffffffffffff188,
             (function<double_(const_double_&)> *)in_stack_fffffffffffff190);
  std::function<double_(const_double_&)>::~function((function<double_(const_double_&)> *)0x102827);
  std::function<double_(const_double_&)>::~function((function<double_(const_double_&)> *)0x102834);
  local_5f0 = 0x3f50624dd2f1a9fc;
  local_5e8 = &local_5f0;
  local_5e0 = 1;
  std::allocator<double>::allocator((allocator<double> *)0x102877);
  __l_01._M_len = (size_type)in_stack_fffffffffffff180;
  __l_01._M_array = (iterator)in_stack_fffffffffffff178;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff170,__l_01,
             in_stack_fffffffffffff168);
  std::allocator<double>::~allocator((allocator<double> *)0x1028ab);
  std::operator<<((ostream *)&std::cout,"Input: x = { ");
  local_600 = local_5d8;
  local_608._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(this);
  local_610 = (double *)std::vector<double,_std::allocator<double>_>::end(this);
  while( true ) {
    bVar5 = __gnu_cxx::operator!=
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )this_00,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)this);
    if (!bVar5) break;
    local_618 = __gnu_cxx::
                __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                operator*(&local_608);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*local_618);
    std::operator<<(poVar6," ");
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_608);
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"}\n");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  nnad::FeedForwardNN<double>::Evaluate
            ((FeedForwardNN<double> *)CONCAT44(in_stack_fffffffffffff34c,in_stack_fffffffffffff348),
             in_stack_fffffffffffff340);
  std::
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  ::operator()(in_stack_fffffffffffff158,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150,
               (vector<double,_std::allocator<double>_> *)Preproc_01);
  local_650 = 0x3ee4f8b588e368f1;
  nnad::FeedForwardNN<double>::GetParameters(in_stack_fffffffffffff1c8);
  sVar7 = std::vector<double,_std::allocator<double>_>::size(&local_668);
  local_66c = (int)sVar7;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x102b44);
  local_68c = 0;
  while( true ) {
    iVar15 = local_68c;
    pvVar8 = std::vector<int,_std::allocator<int>_>::back(&this_00->_Arch);
    if (*pvVar8 <= iVar15) break;
    std::vector<double,_std::allocator<double>_>::operator[](&local_630,(long)local_68c);
    _Var4 = std::pow<double,int>((double)this_00,(int)((ulong)this >> 0x20));
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_648,(long)local_68c);
    local_698 = _Var4 * *pvVar9;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)this_00,(value_type_conflict1 *)this);
    local_68c = local_68c + 1;
  }
  for (local_69c = 0; local_69c < local_66c; local_69c = local_69c + 1) {
    std::vector<double,_std::allocator<double>_>::size(&local_668);
    std::allocator<double>::allocator((allocator<double> *)0x102c9c);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffff160,(size_type)in_stack_fffffffffffff158,
               (allocator_type *)in_stack_fffffffffffff150);
    std::allocator<double>::~allocator((allocator<double> *)0x102cc8);
    std::vector<double,_std::allocator<double>_>::size(&local_668);
    std::allocator<double>::allocator((allocator<double> *)0x102cf2);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffff160,(size_type)in_stack_fffffffffffff158,
               (allocator_type *)in_stack_fffffffffffff150);
    std::allocator<double>::~allocator((allocator<double> *)0x102d1e);
    for (local_6e0 = 0; local_6e0 < local_66c; local_6e0 = local_6e0 + 1) {
      if (local_6e0 == local_69c) {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_668,(long)local_6e0);
        local_d70 = *pvVar9 * 1.00001;
      }
      else {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_668,(long)local_6e0);
        local_d70 = *pvVar9;
      }
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_6b8,(long)local_6e0)
      ;
      *pvVar10 = local_d70;
      if (local_6e0 == local_69c) {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_668,(long)local_6e0);
        local_d80 = *pvVar9 * 0.99999;
      }
      else {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_668,(long)local_6e0);
        local_d80 = *pvVar9;
      }
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_6d8,(long)local_6e0)
      ;
      *pvVar10 = local_d80;
    }
    std::function<double(double_const&)>::function<double(&)(double_const&),void>
              ((function<double_(const_double_&)> *)in_stack_fffffffffffff150,
               (_func_double_double_ptr *)Preproc_01->_M_pod_data);
    std::function<double(double_const&)>::function<double(&)(double_const&),void>
              ((function<double_(const_double_&)> *)in_stack_fffffffffffff150,
               (_func_double_double_ptr *)Preproc_01->_M_pod_data);
    local_92c = 1;
    local_92d = 0;
    this_01 = &local_950;
    std::
    function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
    ::function((function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
                *)this_00,this);
    local_968 = 0;
    uStack_960 = 0;
    local_958 = 0;
    __f = (_func_double_double_ptr *)&local_968;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x102f53);
    puVar12 = &local_92d;
    nnad::FeedForwardNN<double>::FeedForwardNN
              (in_stack_fffffffffffff190,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff188,
               in_stack_fffffffffffff180,in_stack_fffffffffffff178,
               (function<double_(const_double_&)> *)in_stack_fffffffffffff170,
               (OutputFunction *)in_stack_fffffffffffff168,in_stack_fffffffffffff1a0,
               in_stack_fffffffffffff1a8,in_stack_fffffffffffff1b0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
    std::
    function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
    ::~function((function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
                 *)0x102fca);
    std::function<double_(const_double_&)>::~function((function<double_(const_double_&)> *)0x102fd7)
    ;
    std::function<double_(const_double_&)>::~function((function<double_(const_double_&)> *)0x102fe4)
    ;
    std::function<double(double_const&)>::function<double(&)(double_const&),void>
              ((function<double_(const_double_&)> *)in_stack_fffffffffffff150,__f);
    std::function<double(double_const&)>::function<double(&)(double_const&),void>
              ((function<double_(const_double_&)> *)in_stack_fffffffffffff150,__f);
    local_bd8._ActFun.super__Function_base._M_functor._12_4_ = 1;
    local_bd8._ActFun.super__Function_base._M_functor._M_pod_data[0xb] = '\0';
    this_00 = &local_bd8;
    std::
    function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
    ::function(this_01,puVar12);
    local_bf8._M_unused._M_object = (void *)0x0;
    local_bf8._8_8_ = 0;
    local_be8 = 0;
    Preproc_01 = &local_bf8;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x103074);
    this = (vector<double,_std::allocator<double>_> *)
           ((long)&local_bd8._ActFun.super__Function_base._M_functor + 0xb);
    nnad::FeedForwardNN<double>::FeedForwardNN
              (in_stack_fffffffffffff190,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff188,
               in_stack_fffffffffffff180,in_stack_fffffffffffff178,
               (function<double_(const_double_&)> *)in_stack_fffffffffffff170,
               (OutputFunction *)in_stack_fffffffffffff168,in_stack_fffffffffffff1a0,
               in_stack_fffffffffffff1a8,in_stack_fffffffffffff1b0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
    std::
    function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
    ::~function((function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
                 *)0x1030eb);
    std::function<double_(const_double_&)>::~function((function<double_(const_double_&)> *)0x1030f8)
    ;
    std::function<double_(const_double_&)>::~function((function<double_(const_double_&)> *)0x103105)
    ;
    nnad::FeedForwardNN<double>::Evaluate
              ((FeedForwardNN<double> *)
               CONCAT44(in_stack_fffffffffffff34c,in_stack_fffffffffffff348),
               in_stack_fffffffffffff340);
    nnad::FeedForwardNN<double>::Evaluate
              ((FeedForwardNN<double> *)
               CONCAT44(in_stack_fffffffffffff34c,in_stack_fffffffffffff348),
               in_stack_fffffffffffff340);
    local_c2c = 0;
    while( true ) {
      iVar15 = local_c2c;
      pvVar8 = std::vector<int,_std::allocator<int>_>::back(&this_00->_Arch);
      if (*pvVar8 <= iVar15) break;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_630,(long)local_c2c);
      dVar14 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_c10,(long)local_c2c);
      dVar1 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_c28,(long)local_c2c);
      dVar2 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_668,(long)local_69c);
      dVar3 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_648,(long)local_c2c);
      local_c38 = ((((dVar14 + dVar14) * (dVar1 - dVar2) * 0.5) / 1e-05) / dVar3) * *pvVar9;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)this_00,(value_type_conflict1 *)this);
      local_c2c = local_c2c + 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
    nnad::FeedForwardNN<double>::~FeedForwardNN(this_00);
    nnad::FeedForwardNN<double>::~FeedForwardNN(this_00);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
  }
  local_c3c = 0;
  while( true ) {
    iVar15 = local_c3c;
    sVar7 = std::vector<double,_std::allocator<double>_>::size(local_98);
    if ((int)sVar7 <= iVar15) break;
    std::vector<double,_std::allocator<double>_>::size(local_98);
    std::allocator<double>::allocator((allocator<double> *)0x10349f);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffff160,(size_type)in_stack_fffffffffffff158,
               (allocator_type *)in_stack_fffffffffffff150);
    std::allocator<double>::~allocator((allocator<double> *)0x1034cb);
    std::vector<double,_std::allocator<double>_>::size(local_98);
    std::allocator<double>::allocator((allocator<double> *)0x1034f5);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffff160,(size_type)in_stack_fffffffffffff158,
               (allocator_type *)in_stack_fffffffffffff150);
    std::allocator<double>::~allocator((allocator<double> *)0x103521);
    local_c80 = 0;
    while( true ) {
      uVar11 = (ulong)local_c80;
      sVar7 = std::vector<double,_std::allocator<double>_>::size(local_98);
      if (sVar7 <= uVar11) break;
      if (local_c80 == local_c3c) {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_98,(long)local_c80);
        local_e28 = *pvVar9 * 1.00001;
      }
      else {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_98,(long)local_c80);
        local_e28 = *pvVar9;
      }
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_c58,(long)local_c80)
      ;
      *pvVar10 = local_e28;
      if (local_c80 == local_c3c) {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_98,(long)local_c80);
        dVar14 = *pvVar9 * 0.99999;
      }
      else {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_98,(long)local_c80);
        dVar14 = *pvVar9;
      }
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_c78,(long)local_c80)
      ;
      *pvVar10 = dVar14;
      local_c80 = local_c80 + 1;
    }
    std::
    function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
    ::operator()(in_stack_fffffffffffff158,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150,
                 (vector<double,_std::allocator<double>_> *)Preproc_01);
    std::
    function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
    ::operator()(in_stack_fffffffffffff158,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150,
                 (vector<double,_std::allocator<double>_> *)Preproc_01);
    iVar15 = 0;
    while( true ) {
      iVar16 = iVar15;
      pvVar8 = std::vector<int,_std::allocator<int>_>::back(&this_00->_Arch);
      if (*pvVar8 <= iVar15) break;
      std::vector<double,_std::allocator<double>_>::operator[](&local_630,(long)iVar16);
      std::pow<double,int>((double)this_00,(int)((ulong)this >> 0x20));
      std::vector<double,_std::allocator<double>_>::operator[](&local_c98,(long)iVar16);
      std::vector<double,_std::allocator<double>_>::operator[](&local_cb0,(long)iVar16);
      std::vector<double,_std::allocator<double>_>::operator[](local_98,(long)local_c3c);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)this_00,(value_type_conflict1 *)this);
      iVar15 = iVar16 + 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
    local_c3c = local_c3c + 1;
  }
  nnad::FeedForwardNN<double>::Derive(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  sVar7 = std::vector<double,_std::allocator<double>_>::size(&local_cd8);
  std::ostream::operator<<((ostream *)&std::cout,std::scientific);
  poVar6 = std::operator<<((ostream *)&std::cout,"id\t num. ders.\t an. ders.\t   ratio");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  for (local_ce0 = 0; local_ce0 < (int)sVar7; local_ce0 = local_ce0 + 1) {
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_ce0);
    poVar6 = std::operator<<(poVar6,"\t");
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_688,(long)local_ce0);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar10);
    poVar6 = std::operator<<(poVar6,"\t");
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_cd8,(long)local_ce0);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar9);
    poVar6 = std::operator<<(poVar6,"\t");
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_cd8,(long)local_ce0);
    if ((*pvVar9 != 0.0) || (NAN(*pvVar9))) {
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_688,(long)local_ce0)
      ;
      vVar13 = *pvVar10;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_cd8,(long)local_ce0);
      dVar14 = vVar13 / *pvVar9;
    }
    else {
      dVar14 = 0.0;
    }
    in_stack_fffffffffffff150 =
         (function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
          *)std::ostream::operator<<(poVar6,dVar14);
    std::ostream::operator<<
              ((ostream *)in_stack_fffffffffffff150,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  local_4 = 0;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
  nnad::FeedForwardNN<double>::~FeedForwardNN(this_00);
  nnad::FeedForwardNN<double>::~FeedForwardNN(this_00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff150);
  std::
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  ::~function((function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
               *)0x103be8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff150);
  return local_4;
}

Assistant:

int main()
{
  // Define architecture
  const std::vector<int> arch{1, 5, 5, 2};

  // Define preprocessing function
  nnad::FeedForwardNN<double>::Preprocessing Preproc = [] (std::vector<double> const& in, std::vector<double> const& par) -> std::vector<double>
  {
    const double x = in[0];
    const double f1 = pow(x, par[0]) * pow(1 - x, par[1]);
    const double f2 = pow(x, par[2]) * pow(1 - x, par[3]);
    return {f1, f2, log(x) * f1, 0, log(1 - x) * f1, 0, 0, log(x) * f2, 0, log(1 - x) * f2};
  };

  // Preprocessing parameters
  const std::vector<double> parsprep{-1, 1, 2, 3};

  // Initialise NN needed for the numerical derivative
  const nnad::FeedForwardNN<double> nn{arch, 0, nnad::OutputFunction::LINEAR, true};

  // Initialise NN with preprocessing
  const nnad::FeedForwardNN<double> nnp{arch, 0, nnad::OutputFunction::QUADRATIC, true, Preproc, parsprep};

  // Input vector
  std::vector<double> x{0.001};
  std::cout << "Input: x = { ";
  for (auto const& e : x)
    std::cout << e << " ";
  std::cout << "}\n" << std::endl;

  // Get NNs at x
  const std::vector<double> nnl = nn.Evaluate(x);

  // Get preprocessing at x
  const std::vector<double> prepf = Preproc(x, parsprep);

  // Compute the derivatives numerically as incremental ratios
  const double eps = 1e-5;
  const std::vector<double> pars = nn.GetParameters();
  const int np = (int) pars.size();

  // Square and include preprocessing function
  std::vector<double> ders;
  for (int io = 0; io < arch.back(); io++)
    ders.push_back(pow(nnl[io], 2) * prepf[io]);

  // Loop over all derivatives w.r.t the NN parameters
  for (int ip = 0; ip < np; ip++)
    {
      // Displace ip-th parameter by "eps" up and down
      std::vector<double> parsp(pars.size());
      std::vector<double> parsm(pars.size());
      for (int jp = 0; jp < np; jp++)
        {
          parsp[jp] = (jp == ip ? pars[jp] * ( 1 + eps ) : pars[jp]);
          parsm[jp] = (jp == ip ? pars[jp] * ( 1 - eps ) : pars[jp]);
        }

      // Define NNs with the displaced parameters.
      const nnad::FeedForwardNN<double> nnp{arch, parsp};
      const nnad::FeedForwardNN<double> nnm{arch, parsm};

      // Get outputs and compute the derivative numerically
      const std::vector<double> vp = nnp.Evaluate(x);
      const std::vector<double> vm = nnm.Evaluate(x);

      for (int io = 0; io < arch.back(); io++)
        ders.push_back(2 * nnl[io] * ( vp[io] - vm[io] ) / 2 / eps / pars[ip] * prepf[io]);
    }

  // Now include derivatives w.r.t. the preprocessing parameters
  for (int ip = 0; ip < (int) parsprep.size(); ip++)
    {
      // Displace ip-th parameter by "eps" up and down
      std::vector<double> parsp(parsprep.size());
      std::vector<double> parsm(parsprep.size());
      for (int jp = 0; jp < parsprep.size(); jp++)
        {
          parsp[jp] = (jp == ip ? parsprep[jp] * ( 1 + eps ) : parsprep[jp]);
          parsm[jp] = (jp == ip ? parsprep[jp] * ( 1 - eps ) : parsprep[jp]);
        }

      // Define preprocessing function with the displaced parameters.
      const std::vector<double> vp = Preproc(x, parsp);
      const std::vector<double> vm = Preproc(x, parsm);

      for (int io = 0; io < arch.back(); io++)
        ders.push_back(pow(nnl[io], 2) * ( vp[io] - vm[io] ) / 2 / eps / parsprep[ip]);
    }

  // Compare derivatives
  const std::vector<double> anders = nnp.Derive(x);
  const int nd = (int) anders.size();
  std::cout << std::scientific;
  std::cout << "id\t num. ders.\t an. ders.\t   ratio" << std::endl;
  for (int id = 0; id < nd; id++)
    std::cout << id << "\t" << ders[id] << "\t" << anders[id] << "\t" << ( anders[id] == 0 ? 0 : ders[id] / anders[id] ) << std::endl;
  std::cout << "\n";

  return 0;
}